

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.h
# Opt level: O0

void __thiscall
slang::ast::DistExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
          (DistExpression *this,MonitorVisitor *visitor)

{
  bool bVar1;
  Expression *this_00;
  iterator pDVar2;
  DistWeight *pDVar3;
  DistItem *item;
  iterator __end3;
  iterator __begin3;
  span<slang::ast::DistExpression::DistItem,_18446744073709551615UL> *__range3;
  MonitorVisitor *visitor_local;
  DistExpression *this_local;
  
  this_00 = left(this);
  Expression::visit<slang::ast::builtins::MonitorVisitor&>(this_00,visitor);
  __end3 = nonstd::span_lite::span<slang::ast::DistExpression::DistItem,_18446744073709551615UL>::
           begin(&this->items_);
  pDVar2 = nonstd::span_lite::span<slang::ast::DistExpression::DistItem,_18446744073709551615UL>::
           end(&this->items_);
  for (; __end3 != pDVar2; __end3 = __end3 + 1) {
    Expression::visit<slang::ast::builtins::MonitorVisitor&>(__end3->value,visitor);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&__end3->weight);
    if (bVar1) {
      pDVar3 = std::optional<slang::ast::DistExpression::DistWeight>::operator->(&__end3->weight);
      Expression::visit<slang::ast::builtins::MonitorVisitor&>(pDVar3->expr,visitor);
    }
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        left().visit(visitor);
        for (auto& item : items_) {
            item.value.visit(visitor);
            if (item.weight)
                item.weight->expr.visit(visitor);
        }
    }